

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestMissingSubNinja::Run(ParserTestMissingSubNinja *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string err;
  undefined1 local_70 [8];
  ManifestParser parser;
  ParserTestMissingSubNinja *this_local;
  
  parser._88_8_ = this;
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  ManifestParser::ManifestParser
            ((ManifestParser *)local_70,&(this->super_ParserTest).state,
             (FileReader *)&(this->super_ParserTest).fs_,(ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_98);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"subninja foo.ninja\n",&local_b9);
  bVar2 = ManifestParser::ParseTest((ManifestParser *)local_70,&local_b8,(string *)local_98);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x381,"parser.ParseTest(\"subninja foo.ninja\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: loading \'foo.ninja\': No such file or directory\nsubninja foo.ninja\n                  ^ near here"
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x385,
             "\"input:1: loading \'foo.ninja\': No such file or directory\\n\" \"subninja foo.ninja\\n\" \"                  ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

TEST_F(ParserTest, MissingSubNinja) {
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("subninja foo.ninja\n", &err));
  EXPECT_EQ("input:1: loading 'foo.ninja': No such file or directory\n"
            "subninja foo.ninja\n"
            "                  ^ near here"
            , err);
}